

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcb_openssl.cpp
# Opt level: O1

void __thiscall ContextLocker::~ContextLocker(ContextLocker *this)

{
  if ((this->m_cleanup == true) && (*this->m_context != (CTXPTR)0x0)) {
    EVP_CIPHER_CTX_reset();
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)*this->m_context);
    *this->m_context = (CTXPTR)0x0;
  }
  return;
}

Assistant:

~ContextLocker() {
        if (m_cleanup && m_context) {
            EVP_CIPHER_CTX_cleanup(m_context);
            EVP_CIPHER_CTX_free(m_context);
            EVP_cleanup();
            m_context = nullptr;
        }
    }